

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O3

int helicsInputGetStringSize(HelicsInput inp)

{
  int iVar1;
  size_t sVar2;
  
  iVar1 = 0;
  if ((inp != (HelicsInput)0x0) && (iVar1 = 0, *inp == 0x3456e052)) {
    sVar2 = helics::Input::getStringSize(*(Input **)((long)inp + 0x18));
    iVar1 = (int)sVar2 + 1;
  }
  return iVar1;
}

Assistant:

int helicsInputGetStringSize(HelicsInput inp)
{
    auto* inpObj = verifyInput(inp, nullptr);
    if (inpObj == nullptr) {
        return 0;
    }
    try {
        return static_cast<int>(inpObj->inputPtr->getStringSize()) + 1;
    }
    // LCOV_EXCL_START
    catch (...) {
        return 0;
    }
    // LCOV_EXCL_STOP
}